

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_cls_h(target_ulong_conflict r1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (int)(r1 << 0x10) >> 1 ^ r1 << 0x10;
  uVar1 = 0x20;
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar3 = (int)(r1 & 0xffff0000) >> 1 ^ r1 & 0xffff0000;
  if (uVar3 != 0) {
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x1f;
  }
  uVar1 = uVar1 - 1;
  uVar3 = uVar2 - 1;
  if (0xe < uVar2 - 1) {
    uVar3 = 0xf;
  }
  if (0xe < uVar1) {
    uVar1 = 0xf;
  }
  return uVar1 << 0x10 | uVar3;
}

Assistant:

uint32_t helper_cls_h(target_ulong r1)
{
    uint32_t ret_hw0 = extract32(r1, 0, 16);
    uint32_t ret_hw1 = extract32(r1, 16, 16);

    ret_hw0 = clrsb32(ret_hw0 << 16);
    ret_hw1 = clrsb32(ret_hw1 << 16);

    if (ret_hw0 > 15) {
        ret_hw0 = 15;
    }
    if (ret_hw1 > 15) {
        ret_hw1 = 15;
    }

    return ret_hw0 | (ret_hw1 << 16);
}